

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void ts_parser__recover(TSParser *self,StackVersion version,Subtree lookahead)

{
  undefined4 uVar1;
  undefined4 uVar5;
  TSLanguage *pTVar2;
  Subtree *pSVar3;
  Stack *pSVar4;
  bool bVar6;
  bool bVar7;
  undefined8 uVar8;
  _Bool _Var9;
  TSStateId TVar10;
  TSSymbol TVar11;
  uint32_t uVar12;
  uint uVar13;
  uint uVar14;
  uint32_t uVar15;
  StackSummary *pSVar16;
  StackSummaryEntry *pSVar17;
  char *pcVar18;
  Subtree SVar19;
  StackSliceArray SVar20;
  Length LVar21;
  Length LVar22;
  uint local_11c;
  StackSlice *pSStack_118;
  uint i_2;
  StackSliceArray pop;
  MutableSubtree error_repeat;
  SubtreeArray children;
  MutableSubtree local_e8;
  MutableSubtree mutable_lookahead;
  TSParseAction *actions;
  undefined8 uStack_d0;
  uint n;
  uint32_t local_c8;
  undefined8 local_c0;
  uint32_t local_b8;
  uint local_b4;
  Subtree SStack_b0;
  uint new_cost;
  Subtree parent;
  SubtreeArray children_1;
  uint i_1;
  uint new_cost_1;
  uint32_t local_80;
  StackVersion local_74;
  uint j;
  _Bool would_merge;
  uint depth;
  StackSummaryEntry entry;
  uint i;
  uint current_error_cost;
  uint node_count_since_error;
  StackSummary *summary;
  uint32_t local_30;
  uint32_t uStack_2c;
  Length position;
  uint previous_version_count;
  _Bool did_recover;
  StackVersion version_local;
  TSParser *self_local;
  Subtree lookahead_local;
  
  bVar7 = false;
  uVar12 = ts_stack_version_count(self->stack);
  LVar21 = ts_stack_position(self->stack,version);
  pSVar16 = ts_stack_get_summary(self->stack,version);
  uVar13 = ts_stack_node_count_since_error(self->stack,version);
  uVar14 = ts_stack_error_cost(self->stack,version);
  children_1.size = uVar12;
  if ((pSVar16 != (StackSummary *)0x0) && (_Var9 = ts_subtree_is_error(lookahead), !_Var9)) {
    for (entry.depth = 0; entry.depth < pSVar16->size; entry.depth = entry.depth + 1) {
      pSVar17 = pSVar16->contents + entry.depth;
      uVar1 = (pSVar17->position).bytes;
      uVar5 = (pSVar17->position).extent.row;
      entry.position.extent.column._0_2_ = (ushort)*(undefined4 *)&pSVar17->state;
      if ((ushort)entry.position.extent.column != 0) {
        local_30 = LVar21.bytes;
        if (uVar1 != local_30) {
          entry.position.extent.row =
               (uint32_t)((ulong)*(undefined8 *)&(pSVar17->position).extent.column >> 0x20);
          j = entry.position.extent.row;
          if (uVar13 != 0) {
            j = entry.position.extent.row + 1;
          }
          bVar6 = false;
          for (local_74 = 0; local_74 < uVar12; local_74 = local_74 + 1) {
            TVar10 = ts_stack_state(self->stack,local_74);
            if (TVar10 == (ushort)entry.position.extent.column) {
              LVar22 = ts_stack_position(self->stack,local_74);
              local_80 = LVar22.bytes;
              if (local_80 == local_30) {
                bVar6 = true;
                break;
              }
            }
          }
          if (!bVar6) {
            uStack_2c = LVar21.extent.row;
            children_1.capacity =
                 uVar14 + entry.position.extent.row * 100 + (local_30 - uVar1) +
                 (uStack_2c - uVar5) * 0x1e;
            _Var9 = ts_parser__better_version_exists(self,version,false,children_1.capacity);
            if (_Var9) break;
            pTVar2 = self->language;
            TVar11 = ts_subtree_symbol(lookahead);
            _Var9 = ts_language_has_actions(pTVar2,(ushort)entry.position.extent.column,TVar11);
            if ((_Var9) &&
               (_Var9 = ts_parser__recover_to_state
                                  (self,version,j,(ushort)entry.position.extent.column), _Var9)) {
              bVar7 = true;
              if (((self->lexer).logger.log != (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
                 (self->dot_graph_file != (FILE *)0x0)) {
                snprintf((self->lexer).debug_buffer,0x400,"recover_to_previous state:%u, depth:%u",
                         (ulong)(ushort)entry.position.extent.column,(ulong)j);
                ts_parser__log(self);
              }
              if (self->dot_graph_file != (FILE *)0x0) {
                ts_stack_print_dot_graph(self->stack,self->language,self->dot_graph_file);
                fputs("\n\n",(FILE *)self->dot_graph_file);
              }
              break;
            }
          }
        }
      }
    }
  }
  for (; uVar12 = children_1.size, uVar15 = ts_stack_version_count(self->stack), uVar12 < uVar15;
      children_1.size = children_1.size + 1) {
    _Var9 = ts_stack_is_active(self->stack,children_1.size);
    uVar12 = children_1.size;
    if (!_Var9) {
      children_1.size = children_1.size - 1;
      ts_stack_remove_version(self->stack,uVar12);
    }
  }
  if ((bVar7) && (uVar12 = ts_stack_version_count(self->stack), 6 < uVar12)) {
    ts_stack_halt(self->stack,version);
    ts_subtree_release(&self->tree_pool,lookahead);
  }
  else {
    _Var9 = ts_subtree_is_eof(lookahead);
    if (_Var9) {
      if (((self->lexer).logger.log != (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
         (self->dot_graph_file != (FILE *)0x0)) {
        snprintf((self->lexer).debug_buffer,0x400,"recover_eof");
        ts_parser__log(self);
      }
      memset(&parent,0,0x10);
      SStack_b0 = ts_subtree_new_error_node
                            (&self->tree_pool,(SubtreeArray *)&parent.data,false,self->language);
      ts_stack_push(self->stack,version,SStack_b0,false,1);
      ts_parser__accept(self,version,lookahead);
    }
    else {
      uVar12 = ts_subtree_total_bytes(lookahead);
      _uStack_d0 = ts_subtree_total_size(lookahead);
      local_c0 = uStack_d0;
      uVar8 = local_c0;
      local_b8 = local_c8;
      local_c0._4_4_ = uStack_d0._4_4_;
      local_b4 = uVar14 + 100 + uVar12 + local_c0._4_4_ * 0x1e;
      local_c0 = uVar8;
      _Var9 = ts_parser__better_version_exists(self,version,false,local_b4);
      if (_Var9) {
        ts_stack_halt(self->stack,version);
        ts_subtree_release(&self->tree_pool,lookahead);
      }
      else {
        pTVar2 = self->language;
        TVar11 = ts_subtree_symbol(lookahead);
        mutable_lookahead.ptr =
             (SubtreeHeapData *)
             ts_language_actions(pTVar2,1,TVar11,(uint32_t *)((long)&actions + 4));
        self_local = (TSParser *)lookahead;
        if (((actions._4_4_ != 0) &&
            ((*(byte *)((long)&((mutable_lookahead.ptr)->padding).bytes +
                       (ulong)(actions._4_4_ - 1) * 8 + 2) & 0xf) == 0)) &&
           ((*(byte *)((long)&(mutable_lookahead.ptr)->ref_count +
                      (ulong)(actions._4_4_ - 1) * 8 + 2) & 1) != 0)) {
          local_e8 = ts_subtree_make_mut(&self->tree_pool,lookahead);
          ts_subtree_set_extra(&local_e8);
          children._8_8_ = ts_subtree_from_mut(local_e8);
          self_local = (TSParser *)children._8_8_;
        }
        if (((self->lexer).logger.log != (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
           (self->dot_graph_file != (FILE *)0x0)) {
          pTVar2 = self->language;
          TVar11 = ts_subtree_symbol((Subtree)self_local);
          pcVar18 = ts_language_symbol_name(pTVar2,TVar11);
          snprintf((self->lexer).debug_buffer,0x400,"skip_token symbol:%s",pcVar18);
          ts_parser__log(self);
        }
        memset(&error_repeat,0,0x10);
        array__reserve((VoidArray *)&error_repeat.data,8,1);
        array__grow((VoidArray *)&error_repeat.data,8);
        *(TSParser **)(&(error_repeat.ptr)->ref_count + (ulong)(uint)children.contents * 2) =
             self_local;
        children.contents._0_4_ = (uint)children.contents + 1;
        pop._8_8_ = ts_subtree_new_node(&self->tree_pool,0xfffe,(SubtreeArray *)&error_repeat.data,0
                                        ,self->language);
        if (uVar13 != 0) {
          SVar20 = ts_stack_pop_count(self->stack,version,1);
          pop.contents._0_4_ = SVar20.size;
          pSStack_118 = SVar20.contents;
          if (1 < (uint)pop.contents) {
            for (local_11c = 1; local_11c < (uint)pop.contents; local_11c = local_11c + 1) {
              ts_subtree_array_delete(&self->tree_pool,&pSStack_118[local_11c].subtrees);
            }
            while (uVar12 = ts_stack_version_count(self->stack), pSStack_118->version + 1 < uVar12)
            {
              ts_stack_remove_version(self->stack,pSStack_118->version + 1);
            }
          }
          ts_stack_renumber_version(self->stack,pSStack_118->version,version);
          array__grow((VoidArray *)pSStack_118,8);
          pSVar3 = (pSStack_118->subtrees).contents;
          uVar13 = (pSStack_118->subtrees).size;
          (pSStack_118->subtrees).size = uVar13 + 1;
          SVar19 = ts_subtree_from_mut((MutableSubtree)pop._8_8_);
          pSVar3[uVar13] = SVar19;
          pop._8_8_ = ts_subtree_new_node(&self->tree_pool,0xfffe,&pSStack_118->subtrees,0,
                                          self->language);
        }
        pSVar4 = self->stack;
        SVar19 = ts_subtree_from_mut((MutableSubtree)pop._8_8_);
        ts_stack_push(pSVar4,version,SVar19,false,0);
        _Var9 = ts_subtree_has_external_tokens((Subtree)self_local);
        if (_Var9) {
          pSVar4 = self->stack;
          SVar19 = ts_subtree_last_external_token((Subtree)self_local);
          ts_stack_set_last_external_token(pSVar4,version,SVar19);
        }
      }
    }
  }
  return;
}

Assistant:

static void ts_parser__recover(TSParser *self, StackVersion version, Subtree lookahead) {
  bool did_recover = false;
  unsigned previous_version_count = ts_stack_version_count(self->stack);
  Length position = ts_stack_position(self->stack, version);
  StackSummary *summary = ts_stack_get_summary(self->stack, version);
  unsigned node_count_since_error = ts_stack_node_count_since_error(self->stack, version);
  unsigned current_error_cost = ts_stack_error_cost(self->stack, version);

  // When the parser is in the error state, there are two strategies for recovering with a
  // given lookahead token:
  // 1. Find a previous state on the stack in which that lookahead token would be valid. Then,
  //    create a new stack version that is in that state again. This entails popping all of the
  //    subtrees that have been pushed onto the stack since that previous state, and wrapping
  //    them in an ERROR node.
  // 2. Wrap the lookahead token in an ERROR node, push that ERROR node onto the stack, and
  //    move on to the next lookahead token, remaining in the error state.
  //
  // First, try the strategy 1. Upon entering the error state, the parser recorded a summary
  // of the previous parse states and their depths. Look at each state in the summary, to see
  // if the current lookahead token would be valid in that state.
  if (summary && !ts_subtree_is_error(lookahead)) {
    for (unsigned i = 0; i < summary->size; i++) {
      StackSummaryEntry entry = summary->contents[i];

      if (entry.state == ERROR_STATE) continue;
      if (entry.position.bytes == position.bytes) continue;
      unsigned depth = entry.depth;
      if (node_count_since_error > 0) depth++;

      // Do not recover in ways that create redundant stack versions.
      bool would_merge = false;
      for (unsigned j = 0; j < previous_version_count; j++) {
        if (
          ts_stack_state(self->stack, j) == entry.state &&
          ts_stack_position(self->stack, j).bytes == position.bytes
        ) {
          would_merge = true;
          break;
        }
      }
      if (would_merge) continue;

      // Do not recover if the result would clearly be worse than some existing stack version.
      unsigned new_cost =
        current_error_cost +
        entry.depth * ERROR_COST_PER_SKIPPED_TREE +
        (position.bytes - entry.position.bytes) * ERROR_COST_PER_SKIPPED_CHAR +
        (position.extent.row - entry.position.extent.row) * ERROR_COST_PER_SKIPPED_LINE;
      if (ts_parser__better_version_exists(self, version, false, new_cost)) break;

      // If the current lookahead token is valid in some previous state, recover to that state.
      // Then stop looking for further recoveries.
      if (ts_language_has_actions(self->language, entry.state, ts_subtree_symbol(lookahead))) {
        if (ts_parser__recover_to_state(self, version, depth, entry.state)) {
          did_recover = true;
          LOG("recover_to_previous state:%u, depth:%u", entry.state, depth);
          LOG_STACK();
          break;
        }
      }
    }
  }

  // In the process of attemping to recover, some stack versions may have been created
  // and subsequently halted. Remove those versions.
  for (unsigned i = previous_version_count; i < ts_stack_version_count(self->stack); i++) {
    if (!ts_stack_is_active(self->stack, i)) {
      ts_stack_remove_version(self->stack, i--);
    }
  }

  // If strategy 1 succeeded, a new stack version will have been created which is able to handle
  // the current lookahead token. Now, in addition, try strategy 2 described above: skip the
  // current lookahead token by wrapping it in an ERROR node.

  // Don't pursue this additional strategy if there are already too many stack versions.
  if (did_recover && ts_stack_version_count(self->stack) > MAX_VERSION_COUNT) {
    ts_stack_halt(self->stack, version);
    ts_subtree_release(&self->tree_pool, lookahead);
    return;
  }

  // If the parser is still in the error state at the end of the file, just wrap everything
  // in an ERROR node and terminate.
  if (ts_subtree_is_eof(lookahead)) {
    LOG("recover_eof");
    SubtreeArray children = array_new();
    Subtree parent = ts_subtree_new_error_node(&self->tree_pool, &children, false, self->language);
    ts_stack_push(self->stack, version, parent, false, 1);
    ts_parser__accept(self, version, lookahead);
    return;
  }

  // Do not recover if the result would clearly be worse than some existing stack version.
  unsigned new_cost =
    current_error_cost + ERROR_COST_PER_SKIPPED_TREE +
    ts_subtree_total_bytes(lookahead) * ERROR_COST_PER_SKIPPED_CHAR +
    ts_subtree_total_size(lookahead).extent.row * ERROR_COST_PER_SKIPPED_LINE;
  if (ts_parser__better_version_exists(self, version, false, new_cost)) {
    ts_stack_halt(self->stack, version);
    ts_subtree_release(&self->tree_pool, lookahead);
    return;
  }

  // If the current lookahead token is an extra token, mark it as extra. This means it won't
  // be counted in error cost calculations.
  unsigned n;
  const TSParseAction *actions = ts_language_actions(self->language, 1, ts_subtree_symbol(lookahead), &n);
  if (n > 0 && actions[n - 1].type == TSParseActionTypeShift && actions[n - 1].params.extra) {
    MutableSubtree mutable_lookahead = ts_subtree_make_mut(&self->tree_pool, lookahead);
    ts_subtree_set_extra(&mutable_lookahead);
    lookahead = ts_subtree_from_mut(mutable_lookahead);
  }

  // Wrap the lookahead token in an ERROR.
  LOG("skip_token symbol:%s", TREE_NAME(lookahead));
  SubtreeArray children = array_new();
  array_reserve(&children, 1);
  array_push(&children, lookahead);
  MutableSubtree error_repeat = ts_subtree_new_node(
    &self->tree_pool,
    ts_builtin_sym_error_repeat,
    &children,
    0,
    self->language
  );

  // If other tokens have already been skipped, so there is already an ERROR at the top of the
  // stack, then pop that ERROR off the stack and wrap the two ERRORs together into one larger
  // ERROR.
  if (node_count_since_error > 0) {
    StackSliceArray pop = ts_stack_pop_count(self->stack, version, 1);

    // TODO: Figure out how to make this condition occur.
    // See https://github.com/atom/atom/issues/18450#issuecomment-439579778
    // If multiple stack versions have merged at this point, just pick one of the errors
    // arbitrarily and discard the rest.
    if (pop.size > 1) {
      for (unsigned i = 1; i < pop.size; i++) {
        ts_subtree_array_delete(&self->tree_pool, &pop.contents[i].subtrees);
      }
      while (ts_stack_version_count(self->stack) > pop.contents[0].version + 1) {
        ts_stack_remove_version(self->stack, pop.contents[0].version + 1);
      }
    }

    ts_stack_renumber_version(self->stack, pop.contents[0].version, version);
    array_push(&pop.contents[0].subtrees, ts_subtree_from_mut(error_repeat));
    error_repeat = ts_subtree_new_node(
      &self->tree_pool,
      ts_builtin_sym_error_repeat,
      &pop.contents[0].subtrees,
      0,
      self->language
    );
  }

  // Push the new ERROR onto the stack.
  ts_stack_push(self->stack, version, ts_subtree_from_mut(error_repeat), false, ERROR_STATE);
  if (ts_subtree_has_external_tokens(lookahead)) {
    ts_stack_set_last_external_token(
      self->stack, version, ts_subtree_last_external_token(lookahead)
    );
  }
}